

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

char * __thiscall kj::Vector<char>::add<char_const&>(Vector<char> *this,char *params)

{
  bool bVar1;
  char *pcVar2;
  char *params_local;
  Vector<char> *this_local;
  
  bVar1 = ArrayBuilder<char>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  pcVar2 = fwd<char_const&>(params);
  pcVar2 = ArrayBuilder<char>::add<char_const&>(&this->builder,pcVar2);
  return pcVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }